

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O3

char * __thiscall ON_String::Array(ON_String *this)

{
  char *pcVar1;
  char *pcVar2;
  ON_Internal_Empty_aString *pOVar3;
  
  pcVar1 = this->m_s;
  pOVar3 = &empty_astring;
  if (pcVar1 != (char *)0x0) {
    pOVar3 = (ON_Internal_Empty_aString *)(pcVar1 + -0xc);
  }
  pcVar2 = (char *)0x0;
  if (0 < (pOVar3->header).string_capacity) {
    pcVar2 = pcVar1;
  }
  return pcVar2;
}

Assistant:

ON_aStringHeader* ON_String::Header() const
{
  ON_aStringHeader* hdr = (ON_aStringHeader*)m_s;
  if (hdr)
    hdr--;
  else
    hdr = &empty_astring.header;
  return hdr;
}